

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.cc
# Opt level: O0

void read_numbered_sentence_pair
               (string *line,vector<int,_std::allocator<int>_> *s,Dict *sd,
               vector<int,_std::allocator<int>_> *t,Dict *td,
               vector<int,_std::allocator<int>_> *identifiers)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  byte bVar4;
  __type _Var5;
  int iVar6;
  ulong uVar7;
  char *__nptr;
  value_type_conflict *in_RCX;
  value_type_conflict *in_RSI;
  string *in_RDI;
  vector<int,_std::allocator<int>_> *v;
  Dict *d;
  string sep;
  string word;
  istringstream in;
  value_type_conflict *in_stack_fffffffffffffda8;
  value_type_conflict *__x;
  undefined4 in_stack_fffffffffffffdb0;
  undefined2 in_stack_fffffffffffffdb4;
  undefined1 in_stack_fffffffffffffdb6;
  undefined1 in_stack_fffffffffffffdb7;
  istream *in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  value_type_conflict *local_218;
  allocator local_1f1;
  string *in_stack_fffffffffffffe10;
  Dict *in_stack_fffffffffffffe18;
  string local_1d0 [32];
  long local_1b0 [50];
  value_type_conflict *local_20;
  value_type_conflict *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,in_RDI,_S_in);
  std::__cxx11::string::string(local_1d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffe10,"|||",&local_1f1);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  local_218 = local_10;
  uVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_1b0 + *(long *)(local_1b0[0] + -0x18)));
  if ((bool)uVar1) {
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1698a2);
    while( true ) {
      in_stack_fffffffffffffdc8 = std::operator>>((istream *)local_1b0,local_1d0);
      bVar2 = std::ios::operator_cast_to_bool
                        ((ios *)(in_stack_fffffffffffffdc8 +
                                *(long *)(*(long *)in_stack_fffffffffffffdc8 + -0x18)));
      if ((((!bVar2) ||
           (bVar4 = std::ios::operator!((ios *)((long)local_1b0 + *(long *)(local_1b0[0] + -0x18))),
           (bVar4 & 1) != 0)) || (uVar7 = std::__cxx11::string::empty(), (uVar7 & 1) != 0)) ||
         (_Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(uVar1,in_stack_fffffffffffffdd0),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffdc8), _Var5)) break;
      __nptr = (char *)std::__cxx11::string::c_str();
      atoi(__nptr);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT17(in_stack_fffffffffffffdb7,
                          CONCAT16(in_stack_fffffffffffffdb6,
                                   CONCAT24(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0))),
                 in_stack_fffffffffffffda8);
    }
  }
  while (uVar3 = std::ios::operator_cast_to_bool
                           ((ios *)((long)local_1b0 + *(long *)(local_1b0[0] + -0x18))), (bool)uVar3
        ) {
    std::operator>>((istream *)local_1b0,local_1d0);
    bVar4 = std::ios::operator!((ios *)((long)local_1b0 + *(long *)(local_1b0[0] + -0x18)));
    if ((bVar4 & 1) != 0) break;
    _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(uVar1,in_stack_fffffffffffffdd0),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffdc8);
    if (_Var5) {
      local_218 = local_20;
    }
    else {
      __x = local_218;
      iVar6 = dynet::Dict::convert(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT17(uVar3,CONCAT16(bVar4,CONCAT24(in_stack_fffffffffffffdb4,iVar6))),__x);
    }
  }
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe10);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  return;
}

Assistant:

void read_numbered_sentence_pair(const std::string& line, std::vector<int>* s, Dict* sd, std::vector<int>* t, Dict* td, vector<int> &identifiers) 
{
    std::istringstream in(line);
    std::string word;
    std::string sep = "|||";
    Dict* d = sd;
    std::vector<int>* v = s; 

    if (in) {
        identifiers.clear();
        while (in >> word) {
            if (!in || word.empty()) break;
            if (word == sep) break;
            identifiers.push_back(atoi(word.c_str()));
        }
    }

    while(in) {
        in >> word;
        if (!in) break;
        if (word == sep) { d = td; v = t; continue; }
        v->push_back(d->convert(word));
    }
}